

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_stdin.c
# Opt level: O2

int main(void)

{
  size_t sVar1;
  size_t __n;
  char buf [1024];
  
  __n = 0x400;
  do {
    if (__n != 0x400) {
      return 0;
    }
    __n = fread(buf,1,0x400,_stdin);
  } while ((__n == 0) || (sVar1 = fwrite(buf,1,__n,_stdout), sVar1 == __n));
  return 1;
}

Assistant:

int main(void)
{
  char buf[1024];
  size_t nIn = sizeof(buf);
  while (nIn == sizeof(buf)) {
    nIn = fread(buf, 1, sizeof(buf), stdin);
    if (nIn > 0) {
      size_t nOut;
      nOut = fwrite(buf, 1, nIn, stdout);
      if (nOut != nIn) {
        return 1;
      }
    }
  }
  return 0;
}